

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EAM.cpp
# Opt level: O0

void __thiscall OpenMD::EAM::calcForce(EAM *this,InteractionData *idat)

{
  double dVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  byte bVar5;
  reference pvVar6;
  reference pvVar7;
  reference pvVar8;
  reference pvVar9;
  reference pvVar10;
  double *pdVar11;
  int *in_RSI;
  EAM *in_RDI;
  RealType RVar12;
  CubicSplinePtr phi_3;
  CubicSplinePtr phiBCV;
  CubicSplinePtr phiACV;
  CubicSplinePtr phiBCC;
  CubicSplinePtr phiACC;
  CubicSplinePtr phi_2;
  bool insideCutOff;
  bool isExplicit;
  bool hasFlucQ;
  CubicSplinePtr phi_1;
  CubicSplinePtr phi;
  RealType Cj;
  RealType Ci;
  RealType sjp;
  RealType sip;
  RealType sj;
  RealType si;
  RealType Mb;
  RealType Ma;
  RealType Vb;
  RealType Va;
  RealType dudr;
  RealType drhojdr;
  RealType drhoidr;
  RealType dvpdr;
  RealType phab;
  RealType dphb;
  RealType phb;
  RealType dpha;
  RealType pha;
  RealType drhb;
  RealType rhb;
  RealType drha;
  RealType rha;
  RealType rcij;
  RealType rcj;
  RealType rci;
  EAMAtomData *data2;
  EAMAtomData *data1;
  int eamtid2;
  int eamtid1;
  Vector<double,_3U> *in_stack_fffffffffffffdc8;
  Vector<double,_3U> *in_stack_fffffffffffffdd0;
  double dVar13;
  Vector<double,_3U> *in_stack_fffffffffffffdd8;
  byte local_1e9;
  CubicSpline *in_stack_fffffffffffffe30;
  RealType *in_stack_fffffffffffffe48;
  RealType *in_stack_fffffffffffffe50;
  RealType *in_stack_fffffffffffffe58;
  CubicSpline *in_stack_fffffffffffffe60;
  double local_f8;
  double local_f0;
  double local_e8;
  double local_e0;
  double local_d8;
  double local_d0;
  double local_c8;
  double local_c0;
  RealType local_b8;
  RealType local_b0;
  double local_88;
  
  if ((in_RDI->initialized_ & 1U) == 0) {
    initialize((EAM *)phi.super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi);
  }
  if (((in_RDI->haveCutoffRadius_ & 1U) == 0) ||
     (*(double *)(in_RSI + 8) < in_RDI->eamRcut_ || *(double *)(in_RSI + 8) == in_RDI->eamRcut_)) {
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->EAMtids,(long)*in_RSI);
    iVar3 = *pvVar6;
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->EAMtids,(long)in_RSI[1]);
    iVar4 = *pvVar6;
    pvVar7 = std::vector<OpenMD::EAMAtomData,_std::allocator<OpenMD::EAMAtomData>_>::operator[]
                       (&in_RDI->EAMdata,(long)iVar3);
    pvVar8 = std::vector<OpenMD::EAMAtomData,_std::allocator<OpenMD::EAMAtomData>_>::operator[]
                       (&in_RDI->EAMdata,(long)iVar4);
    dVar13 = pvVar7->rcut;
    dVar1 = pvVar8->rcut;
    pvVar9 = std::
             vector<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>,_std::allocator<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>_>_>
             ::operator[](&in_RDI->MixingMap,(long)iVar3);
    pvVar10 = std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>::
              operator[](pvVar9,(long)iVar4);
    dVar2 = pvVar10->rcut;
    local_88 = 0.0;
    local_b0 = 0.0;
    local_b8 = 0.0;
    local_c0 = 0.0;
    local_c8 = 0.0;
    local_d0 = 1.0;
    local_d8 = 1.0;
    local_e0 = 0.0;
    local_e8 = 0.0;
    local_f0 = 1.0;
    local_f8 = 1.0;
    operator/(in_stack_fffffffffffffdd8,(double)in_stack_fffffffffffffdd0);
    Vector3<double>::operator=
              ((Vector3<double> *)in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
    if ((*(double *)(in_RSI + 8) < dVar13) && (*(double *)(in_RSI + 8) < dVar2)) {
      std::__shared_ptr_access<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x3b0287);
      CubicSpline::getValueAndDerivativeAt
                (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,
                 in_stack_fffffffffffffe48);
      pvVar9 = std::
               vector<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>,_std::allocator<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>_>_>
               ::operator[](&in_RDI->MixingMap,(long)iVar3);
      std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>::
      operator[](pvVar9,(long)iVar3);
      std::shared_ptr<OpenMD::CubicSpline>::shared_ptr
                ((shared_ptr<OpenMD::CubicSpline> *)in_stack_fffffffffffffdd0,
                 (shared_ptr<OpenMD::CubicSpline> *)in_stack_fffffffffffffdc8);
      std::__shared_ptr_access<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x3b02f0);
      CubicSpline::getValueAndDerivativeAt
                (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,
                 in_stack_fffffffffffffe48);
      std::shared_ptr<OpenMD::CubicSpline>::~shared_ptr((shared_ptr<OpenMD::CubicSpline> *)0x3b0323)
      ;
    }
    if ((*(double *)(in_RSI + 8) < dVar1) && (*(double *)(in_RSI + 8) < dVar2)) {
      std::__shared_ptr_access<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x3b0398);
      CubicSpline::getValueAndDerivativeAt
                (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,
                 in_stack_fffffffffffffe48);
      pvVar9 = std::
               vector<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>,_std::allocator<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>_>_>
               ::operator[](&in_RDI->MixingMap,(long)iVar4);
      std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>::
      operator[](pvVar9,(long)iVar4);
      std::shared_ptr<OpenMD::CubicSpline>::shared_ptr
                ((shared_ptr<OpenMD::CubicSpline> *)in_stack_fffffffffffffdd0,
                 (shared_ptr<OpenMD::CubicSpline> *)in_stack_fffffffffffffdc8);
      std::__shared_ptr_access<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x3b0401);
      CubicSpline::getValueAndDerivativeAt
                (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,
                 in_stack_fffffffffffffe48);
      std::shared_ptr<OpenMD::CubicSpline>::~shared_ptr((shared_ptr<OpenMD::CubicSpline> *)0x3b0434)
      ;
    }
    local_1e9 = 1;
    if ((pvVar7->isFluctuatingCharge & 1U) == 0) {
      local_1e9 = pvVar8->isFluctuatingCharge;
    }
    pvVar9 = std::
             vector<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>,_std::allocator<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>_>_>
             ::operator[](&in_RDI->MixingMap,(long)iVar3);
    pvVar10 = std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>::
              operator[](pvVar9,(long)iVar4);
    bVar5 = pvVar10->explicitlySet & 1;
    if ((local_1e9 & 1) == 0) {
      if (*(double *)(in_RSI + 8) < dVar2) {
        pvVar9 = std::
                 vector<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>,_std::allocator<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>_>_>
                 ::operator[](&in_RDI->MixingMap,(long)iVar3);
        std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>::
        operator[](pvVar9,(long)iVar4);
        std::shared_ptr<OpenMD::CubicSpline>::shared_ptr
                  ((shared_ptr<OpenMD::CubicSpline> *)in_stack_fffffffffffffdd0,
                   (shared_ptr<OpenMD::CubicSpline> *)in_stack_fffffffffffffdc8);
        std::__shared_ptr_access<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x3b142a);
        CubicSpline::getValueAndDerivativeAt
                  (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,
                   in_stack_fffffffffffffe48);
        std::shared_ptr<OpenMD::CubicSpline>::~shared_ptr
                  ((shared_ptr<OpenMD::CubicSpline> *)0x3b145d);
      }
    }
    else {
      if ((pvVar7->isFluctuatingCharge & 1U) != 0) {
        local_b0 = pvVar7->nValence;
        local_c0 = pvVar7->nMobile;
        if (in_RDI->mixMeth_ == eamDream2) {
          local_d0 = gFunc(in_RDI,*(RealType *)(in_RSI + 0xbc),local_b0,local_c0);
        }
        else {
          local_d0 = (local_b0 - *(double *)(in_RSI + 0xbc)) / local_b0;
        }
      }
      if ((pvVar8->isFluctuatingCharge & 1U) != 0) {
        local_b8 = pvVar8->nValence;
        local_c8 = pvVar8->nMobile;
        if (in_RDI->mixMeth_ == eamDream2) {
          local_d8 = gFunc(in_RDI,*(RealType *)(in_RSI + 0xbe),local_b8,local_c8);
        }
        else {
          local_d8 = (local_b8 - *(double *)(in_RSI + 0xbe)) / local_b8;
        }
      }
      if ((in_RDI->mixMeth_ == eamJohnson) || (in_RDI->mixMeth_ == eamDream1)) {
        if ((*(double *)(in_RSI + 8) < dVar13) && (*(double *)(in_RSI + 8) < dVar2)) {
          local_88 = (local_d8 / local_d0) * 0.5 * NAN * 0.0 + 0.0;
          if ((pvVar7->isFluctuatingCharge & 1U) != 0) {
            *(double *)(in_RSI + 0xc0) =
                 (local_d8 * 0.0 * 0.0 * 0.5) / (local_c0 * 0.0 * local_d0 * local_d0) +
                 *(double *)(in_RSI + 0xc0);
          }
          if ((pvVar8->isFluctuatingCharge & 1U) != 0) {
            *(double *)(in_RSI + 0xc2) =
                 *(double *)(in_RSI + 0xc2) - 0.0 / (local_c8 * 0.0 * local_d0);
          }
        }
        if ((*(double *)(in_RSI + 8) < dVar1) && (*(double *)(in_RSI + 8) < dVar2)) {
          local_88 = (local_d0 / local_d8) * 0.5 * NAN * 0.0 + local_88;
          if ((pvVar7->isFluctuatingCharge & 1U) != 0) {
            *(double *)(in_RSI + 0xc0) =
                 *(double *)(in_RSI + 0xc0) - 0.0 / (local_c0 * 0.0 * local_d8);
          }
          if ((pvVar8->isFluctuatingCharge & 1U) != 0) {
            *(double *)(in_RSI + 0xc2) =
                 (local_d0 * 0.0 * 0.0 * 0.5) / (local_c8 * 0.0 * local_d8 * local_d8) +
                 *(double *)(in_RSI + 0xc2);
          }
        }
      }
      else {
        if (bVar5 == 0) {
          if ((*(double *)(in_RSI + 8) < dVar13) && (*(double *)(in_RSI + 8) < dVar2)) {
            std::shared_ptr<OpenMD::CubicSpline>::shared_ptr
                      ((shared_ptr<OpenMD::CubicSpline> *)in_stack_fffffffffffffdd0,
                       (shared_ptr<OpenMD::CubicSpline> *)in_stack_fffffffffffffdc8);
            std::__shared_ptr_access<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x3b0bce);
            CubicSpline::getValueAndDerivativeAt
                      (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,in_stack_fffffffffffffe50
                       ,in_stack_fffffffffffffe48);
            local_88 = NAN;
            std::shared_ptr<OpenMD::CubicSpline>::~shared_ptr
                      ((shared_ptr<OpenMD::CubicSpline> *)0x3b0cce);
          }
          if ((*(double *)(in_RSI + 8) < dVar1) && (*(double *)(in_RSI + 8) < dVar2)) {
            std::shared_ptr<OpenMD::CubicSpline>::shared_ptr
                      ((shared_ptr<OpenMD::CubicSpline> *)in_stack_fffffffffffffdd0,
                       (shared_ptr<OpenMD::CubicSpline> *)in_stack_fffffffffffffdc8);
            std::__shared_ptr_access<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x3b0d5e);
            CubicSpline::getValueAndDerivativeAt
                      (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,in_stack_fffffffffffffe50
                       ,in_stack_fffffffffffffe48);
            local_88 = local_88 + NAN;
            std::shared_ptr<OpenMD::CubicSpline>::~shared_ptr
                      ((shared_ptr<OpenMD::CubicSpline> *)0x3b0e5e);
          }
        }
        else if (*(double *)(in_RSI + 8) < dVar2) {
          pvVar9 = std::
                   vector<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>,_std::allocator<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>_>_>
                   ::operator[](&in_RDI->MixingMap,(long)iVar3);
          std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>::
          operator[](pvVar9,(long)iVar4);
          std::shared_ptr<OpenMD::CubicSpline>::shared_ptr
                    ((shared_ptr<OpenMD::CubicSpline> *)in_stack_fffffffffffffdd0,
                     (shared_ptr<OpenMD::CubicSpline> *)in_stack_fffffffffffffdc8);
          std::__shared_ptr_access<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x3b0b06);
          CubicSpline::getValueAndDerivativeAt
                    (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,
                     in_stack_fffffffffffffe48);
          std::shared_ptr<OpenMD::CubicSpline>::~shared_ptr
                    ((shared_ptr<OpenMD::CubicSpline> *)0x3b0b39);
        }
        if (bVar5 != 0) {
          pvVar9 = std::
                   vector<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>,_std::allocator<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>_>_>
                   ::operator[](&in_RDI->MixingMap,(long)iVar3);
          pvVar10 = std::
                    vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>
                    ::operator[](pvVar9,(long)iVar4);
          local_f0 = pvVar10->Ci;
          pvVar9 = std::
                   vector<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>,_std::allocator<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>_>_>
                   ::operator[](&in_RDI->MixingMap,(long)iVar3);
          pvVar10 = std::
                    vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>
                    ::operator[](pvVar9,(long)iVar4);
          local_f8 = pvVar10->Cj;
        }
        if ((pvVar7->isFluctuatingCharge & 1U) != 0) {
          local_e0 = gPrime(in_RDI,*(RealType *)(in_RSI + 0xbc),local_b0,local_c0);
        }
        if ((pvVar8->isFluctuatingCharge & 1U) != 0) {
          local_e8 = gPrime(in_RDI,*(RealType *)(in_RSI + 0xbe),local_b8,local_c8);
        }
        if ((*(double *)(in_RSI + 8) < dVar13) && (*(double *)(in_RSI + 8) < dVar2)) {
          std::shared_ptr<OpenMD::CubicSpline>::shared_ptr
                    ((shared_ptr<OpenMD::CubicSpline> *)in_stack_fffffffffffffdd0,
                     (shared_ptr<OpenMD::CubicSpline> *)in_stack_fffffffffffffdc8);
          std::__shared_ptr_access<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x3b0fe8);
          CubicSpline::getValueAndDerivativeAt
                    (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,
                     in_stack_fffffffffffffe48);
          local_88 = local_d8 * 0.5 * local_f0 * NAN * 0.0 + local_88;
          if ((pvVar8->isFluctuatingCharge & 1U) != 0) {
            *(double *)(in_RSI + 0xc2) =
                 local_e8 * 0.5 * local_f0 * NAN * 0.0 + *(double *)(in_RSI + 0xc2);
          }
          std::shared_ptr<OpenMD::CubicSpline>::~shared_ptr
                    ((shared_ptr<OpenMD::CubicSpline> *)0x3b119f);
        }
        if ((*(double *)(in_RSI + 8) < dVar1) && (*(double *)(in_RSI + 8) < dVar2)) {
          std::shared_ptr<OpenMD::CubicSpline>::shared_ptr
                    ((shared_ptr<OpenMD::CubicSpline> *)in_stack_fffffffffffffdd0,
                     (shared_ptr<OpenMD::CubicSpline> *)in_stack_fffffffffffffdc8);
          std::__shared_ptr_access<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x3b1207);
          CubicSpline::getValueAndDerivativeAt
                    (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,
                     in_stack_fffffffffffffe48);
          local_88 = local_d0 * 0.5 * local_f8 * NAN * 0.0 + local_88;
          if ((pvVar7->isFluctuatingCharge & 1U) != 0) {
            *(double *)(in_RSI + 0xc0) =
                 local_e0 * 0.5 * local_f8 * NAN * 0.0 + *(double *)(in_RSI + 0xc0);
          }
          std::shared_ptr<OpenMD::CubicSpline>::~shared_ptr
                    ((shared_ptr<OpenMD::CubicSpline> *)0x3b13be);
        }
      }
    }
    OpenMD::operator*(in_stack_fffffffffffffdd8,(double)in_stack_fffffffffffffdd0);
    Vector<double,_3U>::operator+=(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
    if ((*(byte *)(in_RSI + 0x36) & 1) != 0) {
      std::__shared_ptr_access<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x3b1567);
      RVar12 = CubicSpline::getValueAt(in_stack_fffffffffffffe30,(RealType *)in_RDI);
      *(double *)(in_RSI + 0x46) =
           (RVar12 - *(double *)(in_RSI + 0xb6)) + *(double *)(in_RSI + 0x46);
      std::__shared_ptr_access<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x3b15cc);
      RVar12 = CubicSpline::getValueAt
                         ((CubicSpline *)(*(double *)(in_RSI + 0xb0) - 0.0),(RealType *)in_RDI);
      *(double *)(in_RSI + 0x48) =
           (RVar12 - *(double *)(in_RSI + 0xb4)) + *(double *)(in_RSI + 0x48);
    }
    dVar13 = local_88;
    pdVar11 = Vector<double,_7U>::operator[]((Vector<double,_7U> *)(in_RSI + 0x18),4);
    *pdVar11 = dVar13 + *pdVar11;
    if ((*(byte *)((long)in_RSI + 0xdb) & 1) != 0) {
      dVar13 = local_88;
      pdVar11 = Vector<double,_7U>::operator[]((Vector<double,_7U> *)(in_RSI + 0x38),4);
      *pdVar11 = dVar13 + *pdVar11;
    }
    *(double *)(in_RSI + 0x34) = local_88 + *(double *)(in_RSI + 0x34);
    if ((pvVar7->isFluctuatingCharge & 1U) != 0) {
      if (in_RDI->mixMeth_ == eamDream2) {
        *(double *)(in_RSI + 0xc0) =
             *(double *)(in_RSI + 0xba) * 0.0 * local_e0 + *(double *)(in_RSI + 0xc0);
      }
      else {
        *(double *)(in_RSI + 0xc0) =
             *(double *)(in_RSI + 0xc0) - (*(double *)(in_RSI + 0xba) * 0.0) / local_b0;
      }
    }
    if ((pvVar8->isFluctuatingCharge & 1U) != 0) {
      if (in_RDI->mixMeth_ == eamDream2) {
        *(double *)(in_RSI + 0xc2) =
             *(double *)(in_RSI + 0xb8) * 0.0 * local_e8 + *(double *)(in_RSI + 0xc2);
      }
      else {
        *(double *)(in_RSI + 0xc2) =
             *(double *)(in_RSI + 0xc2) - (*(double *)(in_RSI + 0xb8) * 0.0) / local_b8;
      }
    }
  }
  return;
}

Assistant:

void EAM::calcForce(InteractionData& idat) {
    if (!initialized_) initialize();

    if (haveCutoffRadius_)
      if (idat.rij > eamRcut_) return;

    int eamtid1        = EAMtids[idat.atid1];
    int eamtid2        = EAMtids[idat.atid2];
    EAMAtomData& data1 = EAMdata[eamtid1];
    EAMAtomData& data2 = EAMdata[eamtid2];

    // get type-specific cutoff radii

    RealType rci  = data1.rcut;
    RealType rcj  = data2.rcut;
    RealType rcij = MixingMap[eamtid1][eamtid2].rcut;

    RealType rha(0.0), drha(0.0), rhb(0.0), drhb(0.0);
    RealType pha(0.0), dpha(0.0), phb(0.0), dphb(0.0);

    RealType phab(0.0), dvpdr(0.0);
    RealType drhoidr(0.0), drhojdr(0.0), dudr(0.0);
    // For DREAM, we need nValence (Va, Vb), nMobile (Ma, Mb), for
    // each type, and density scaling variables (si, sj) for each atom:
    RealType Va(0.0), Vb(0.0);
    RealType Ma(0.0), Mb(0.0);
    RealType si(1.0), sj(1.0);
    RealType sip(0.0), sjp(0.0);
    RealType Ci(1.0), Cj(1.0);

    rhat = idat.d / idat.rij;
    if (idat.rij < rci && idat.rij < rcij) {
      data1.rho->getValueAndDerivativeAt(idat.rij, rha, drha);
      CubicSplinePtr phi = MixingMap[eamtid1][eamtid1].phi;
      phi->getValueAndDerivativeAt(idat.rij, pha, dpha);
    }

    if (idat.rij < rcj && idat.rij < rcij) {
      data2.rho->getValueAndDerivativeAt(idat.rij, rhb, drhb);
      CubicSplinePtr phi = MixingMap[eamtid2][eamtid2].phi;
      phi->getValueAndDerivativeAt(idat.rij, phb, dphb);
    }

    bool hasFlucQ   = data1.isFluctuatingCharge || data2.isFluctuatingCharge;
    bool isExplicit = MixingMap[eamtid1][eamtid2].explicitlySet;
    if (hasFlucQ) {
      if (data1.isFluctuatingCharge) {
        Va = data1.nValence;
        Ma = data1.nMobile;
        if (mixMeth_ == eamDream2)
          si = gFunc(idat.flucQ1, Va, Ma);
        else
          si = (Va - idat.flucQ1) / Va;
      }
      if (data2.isFluctuatingCharge) {
        Vb = data2.nValence;
        Mb = data2.nMobile;
        if (mixMeth_ == eamDream2)
          sj = gFunc(idat.flucQ2, Vb, Mb);
        else
          sj = (Vb - idat.flucQ2) / Vb;
      }

      if (mixMeth_ == eamJohnson || mixMeth_ == eamDream1) {
        if (idat.rij < rci && idat.rij < rcij) {
          phab  = phab + 0.5 * (sj / si) * (rhb / rha) * pha;
          dvpdr = dvpdr + 0.5 * (sj / si) *
                              ((rhb / rha) * dpha +
                               pha * ((drhb / rha) - (rhb * drha / rha / rha)));

          if (data1.isFluctuatingCharge) {
            idat.dVdFQ1 += 0.5 * (rhb * sj * pha) / (rha * Ma * si * si);
          }
          if (data2.isFluctuatingCharge) {
            idat.dVdFQ2 -= 0.5 * (rhb * pha) / (rha * Mb * si);
          }
        }

        if (idat.rij < rcj && idat.rij < rcij) {
          phab  = phab + 0.5 * (si / sj) * (rha / rhb) * phb;
          dvpdr = dvpdr + 0.5 * (si / sj) *
                              ((rha / rhb) * dphb +
                               phb * ((drha / rhb) - (rha * drhb / rhb / rhb)));

          if (data1.isFluctuatingCharge) {
            idat.dVdFQ1 -= 0.5 * (rha * phb) / (rhb * Ma * sj);
          }
          if (data2.isFluctuatingCharge) {
            idat.dVdFQ2 += 0.5 * (rha * si * phb) / (rhb * Mb * sj * sj);
          }
        }
      } else {
        if (isExplicit) {
          // phi is total potential for EAMTable and EAMZhou but CC interaction
          // for EAMOxide potential
          bool insideCutOff = (idat.rij < rcij);
          if (insideCutOff) {
            CubicSplinePtr phi = MixingMap[eamtid1][eamtid2].phi;
            phi->getValueAndDerivativeAt(idat.rij, phab, dvpdr);
          }

        } else {
          // Core-Core part first - no fluctuating charge, just Johnson mixing:

          if (idat.rij < rci && idat.rij < rcij) {
            CubicSplinePtr phiACC = data1.phiCC;
            phiACC->getValueAndDerivativeAt(idat.rij, pha, dpha);
            phab += 0.5 * (rhb / rha) * pha;
            dvpdr += 0.5 * ((rhb / rha) * dpha +
                            pha * ((drhb / rha) - (rhb * drha / rha / rha)));
          }
          if (idat.rij < rcj && idat.rij < rcij) {
            CubicSplinePtr phiBCC = data2.phiCC;
            phiBCC->getValueAndDerivativeAt(idat.rij, phb, dphb);
            phab += 0.5 * (rha / rhb) * phb;
            dvpdr += 0.5 * ((rha / rhb) * dphb +
                            phb * ((drha / rhb) - (rha * drhb / rhb / rhb)));
          }
        }

        if (isExplicit) {
          // Ci, Cj are 0 for EAMTable and EAMZhou. So, there is no CV
          // interaction
          Ci = MixingMap[eamtid1][eamtid2].Ci;
          Cj = MixingMap[eamtid1][eamtid2].Cj;
        }
        // Core-Valence next, this does include fluctuating charges:

        if (data1.isFluctuatingCharge) { sip = gPrime(idat.flucQ1, Va, Ma); }
        if (data2.isFluctuatingCharge) { sjp = gPrime(idat.flucQ2, Vb, Mb); }

        if (idat.rij < rci && idat.rij < rcij) {
          CubicSplinePtr phiACV = data1.phiCV;
          phiACV->getValueAndDerivativeAt(idat.rij, pha, dpha);

          phab += 0.5 * sj * Ci * (rhb / rha) * pha;
          dvpdr += 0.5 * sj * Ci *
                   ((rhb / rha) * dpha +
                    pha * ((drhb / rha) - (rhb * drha / rha / rha)));

          if (data2.isFluctuatingCharge) {
            idat.dVdFQ2 += 0.5 * sjp * Ci * (rhb / rha) * pha;
          }
        }
        if (idat.rij < rcj && idat.rij < rcij) {
          CubicSplinePtr phiBCV = data2.phiCV;
          phiBCV->getValueAndDerivativeAt(idat.rij, phb, dphb);

          phab += 0.5 * si * Cj * (rha / rhb) * phb;
          dvpdr += 0.5 * si * Cj *
                   ((rha / rhb) * dphb +
                    phb * ((drha / rhb) - (rha * drhb / rhb / rhb)));

          if (data1.isFluctuatingCharge) {
            idat.dVdFQ1 += 0.5 * sip * Cj * (rha / rhb) * phb;
          }
        }
      }
    } else {
      if (idat.rij < rcij) {
        CubicSplinePtr phi = MixingMap[eamtid1][eamtid2].phi;
        phi->getValueAndDerivativeAt(idat.rij, phab, dvpdr);
      }
    }
    drhoidr = si * drha;
    drhojdr = sj * drhb;
    dudr    = drhojdr * idat.dfrho1 + drhoidr * idat.dfrho2 + dvpdr;

    idat.f1 += rhat * dudr;

    if (idat.doParticlePot) {
      // particlePot is the difference between the full potential and
      // the full potential without the presence of a particular
      // particle (atom1).
      //
      // This reduces the density at other particle locations, so we
      // need to recompute the density at atom2 assuming atom1 didn't
      // contribute.  This then requires recomputing the density
      // functional for atom2 as well.

      idat.particlePot1 += data2.F->getValueAt(idat.rho2 - rha) - idat.frho2;

      idat.particlePot2 += data1.F->getValueAt(idat.rho1 - rhb) - idat.frho1;
    }

    idat.pot[METALLIC_PAIR_FAMILY] += phab;
    if (idat.isSelected) idat.selePot[METALLIC_PAIR_FAMILY] += phab;

    idat.vpair += phab;

    // When densities are fluctuating, the functional depends on the
    // fluctuating densities from other sites:
    if (data1.isFluctuatingCharge) {
      if (mixMeth_ == eamDream2)
        idat.dVdFQ1 += idat.dfrho2 * rha * sip;
      else
        idat.dVdFQ1 -= idat.dfrho2 * rha / Va;
    }
    if (data2.isFluctuatingCharge) {
      if (mixMeth_ == eamDream2)
        idat.dVdFQ2 += idat.dfrho1 * rhb * sjp;
      else
        idat.dVdFQ2 -= idat.dfrho1 * rhb / Vb;
    }

    return;
  }